

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTableBuilderVisitor.cpp
# Opt level: O1

SymbolTable * __thiscall
hdc::SymbolTableBuilderVisitor::pushSymbolTable(SymbolTableBuilderVisitor *this)

{
  iterator *piVar1;
  SymbolTable *parent;
  _Elt_pointer ppSVar2;
  SymbolTable *this_00;
  
  parent = this->symbolTable;
  ppSVar2 = (this->symbolTableStack).c.
            super__Deque_base<hdc::SymbolTable_*,_std::allocator<hdc::SymbolTable_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  if (ppSVar2 ==
      (this->symbolTableStack).c.
      super__Deque_base<hdc::SymbolTable_*,_std::allocator<hdc::SymbolTable_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<hdc::SymbolTable*,std::allocator<hdc::SymbolTable*>>::
    _M_push_back_aux<hdc::SymbolTable*const&>
              ((deque<hdc::SymbolTable*,std::allocator<hdc::SymbolTable*>> *)&this->symbolTableStack
               ,&this->symbolTable);
  }
  else {
    *ppSVar2 = parent;
    piVar1 = &(this->symbolTableStack).c.
              super__Deque_base<hdc::SymbolTable_*,_std::allocator<hdc::SymbolTable_*>_>._M_impl.
              super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  this_00 = (SymbolTable *)operator_new(0x48);
  SymbolTable::SymbolTable(this_00,parent);
  this->symbolTable = this_00;
  return this_00;
}

Assistant:

SymbolTable *SymbolTableBuilderVisitor::pushSymbolTable() {
    SymbolTable* old;

    old = symbolTable;
    symbolTableStack.push(symbolTable);
    symbolTable = new SymbolTable(old);

    return symbolTable;
}